

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlschemas.c
# Opt level: O0

xmlSchemaAttributePtr_conflict
xmlSchemaAddAttribute
          (xmlSchemaParserCtxtPtr ctxt,xmlSchemaPtr schema,xmlChar *name,xmlChar *nsName,
          xmlNodePtr node,int topLevel)

{
  xmlSchemaAttributePtr_conflict ret;
  int topLevel_local;
  xmlNodePtr node_local;
  xmlChar *nsName_local;
  xmlChar *name_local;
  xmlSchemaPtr schema_local;
  xmlSchemaParserCtxtPtr ctxt_local;
  
  if ((ctxt == (xmlSchemaParserCtxtPtr)0x0) || (schema == (xmlSchemaPtr)0x0)) {
    ctxt_local = (xmlSchemaParserCtxtPtr)0x0;
  }
  else {
    ctxt_local = (xmlSchemaParserCtxtPtr)(*xmlMalloc)(0x98);
    if (ctxt_local == (xmlSchemaParserCtxtPtr)0x0) {
      xmlSchemaPErrMemory(ctxt,"allocating attribute",(xmlNodePtr)0x0);
      ctxt_local = (xmlSchemaParserCtxtPtr)0x0;
    }
    else {
      memset(ctxt_local,0,0x98);
      ctxt_local->type = 0xf;
      ctxt_local->buffer = (char *)node;
      ctxt_local->error = (xmlSchemaValidityErrorFunc)name;
      *(xmlChar **)&ctxt_local->size = nsName;
      if (topLevel == 0) {
        xmlSchemaAddItemSize(&ctxt->constructor->bucket->locals,10,ctxt_local);
      }
      else {
        xmlSchemaAddItemSize(&ctxt->constructor->bucket->globals,5,ctxt_local);
      }
      xmlSchemaAddItemSize(&ctxt->constructor->pending,10,ctxt_local);
    }
  }
  return (xmlSchemaAttributePtr_conflict)ctxt_local;
}

Assistant:

static xmlSchemaAttributePtr
xmlSchemaAddAttribute(xmlSchemaParserCtxtPtr ctxt, xmlSchemaPtr schema,
                      const xmlChar * name, const xmlChar * nsName,
		      xmlNodePtr node, int topLevel)
{
    xmlSchemaAttributePtr ret = NULL;

    if ((ctxt == NULL) || (schema == NULL))
        return (NULL);

    ret = (xmlSchemaAttributePtr) xmlMalloc(sizeof(xmlSchemaAttribute));
    if (ret == NULL) {
        xmlSchemaPErrMemory(ctxt, "allocating attribute", NULL);
        return (NULL);
    }
    memset(ret, 0, sizeof(xmlSchemaAttribute));
    ret->type = XML_SCHEMA_TYPE_ATTRIBUTE;
    ret->node = node;
    ret->name = name;
    ret->targetNamespace = nsName;

    if (topLevel)
	WXS_ADD_GLOBAL(ctxt, ret);
    else
	WXS_ADD_LOCAL(ctxt, ret);
    WXS_ADD_PENDING(ctxt, ret);
    return (ret);
}